

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::Capture(Regexp *sub,ParseFlags flags,int cap)

{
  Regexp *this;
  Regexp **ppRVar1;
  int in_EDX;
  Regexp *in_RDI;
  Regexp *re;
  undefined8 in_stack_ffffffffffffffc8;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,(RegexpOp)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
         (ParseFlags)in_stack_ffffffffffffffc8);
  AllocSub(this,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  ppRVar1 = Regexp::sub(this);
  *ppRVar1 = in_RDI;
  (this->field_7).field_0.max_ = in_EDX;
  return this;
}

Assistant:

Regexp* Regexp::Capture(Regexp* sub, ParseFlags flags, int cap) {
  Regexp* re = new Regexp(kRegexpCapture, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  re->cap_ = cap;
  return re;
}